

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gpnp3::groebnerRow6_000_f
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar7 = (long)targetRow;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xa5];
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar8 = vxorpd_avx512vl(auVar9,auVar6);
  auVar10._0_8_ =
       auVar8._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xab];
  auVar10._8_8_ = auVar8._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xa5] = 0.0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xba];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xb4];
  auVar8 = vfmadd213sd_fma(auVar11,auVar10,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xb4] = auVar8._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xc9];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xc3];
  auVar8 = vfmadd213sd_fma(auVar12,auVar10,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xc3] = auVar8._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xd8];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xd2];
  auVar8 = vfmadd213sd_fma(auVar13,auVar10,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xd2] = auVar8._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xe7];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xe1];
  auVar8 = vfmadd213sd_fma(auVar14,auVar10,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xe1] = auVar8._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf6];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xf0];
  auVar8 = vfmadd213sd_fma(auVar15,auVar10,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xf0] = auVar8._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x105];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar7 + 0xff];
  auVar8 = vfmadd213sd_fma(auVar16,auVar10,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar7 + 0xff] = auVar8._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::groebnerRow6_000_f( Eigen::Matrix<double,15,18> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,11) / groebnerMatrix(6,11);
  groebnerMatrix(targetRow,11) = 0.0;
  groebnerMatrix(targetRow,12) -= factor * groebnerMatrix(6,12);
  groebnerMatrix(targetRow,13) -= factor * groebnerMatrix(6,13);
  groebnerMatrix(targetRow,14) -= factor * groebnerMatrix(6,14);
  groebnerMatrix(targetRow,15) -= factor * groebnerMatrix(6,15);
  groebnerMatrix(targetRow,16) -= factor * groebnerMatrix(6,16);
  groebnerMatrix(targetRow,17) -= factor * groebnerMatrix(6,17);
}